

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O1

IfcVector3 * __thiscall
Assimp::IFC::anon_unknown_9::Circle::Eval
          (IfcVector3 *__return_storage_ptr__,Circle *this,IfcFloat u)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar10 = u * -((this->super_Conic).super_Curve.conv)->angle_scale;
  dVar1 = *(double *)&(this->entity->super_IfcConic).field_0x60;
  dVar8 = cos(dVar10);
  dVar2 = (this->super_Conic).p[0].x;
  dVar3 = (this->super_Conic).p[0].y;
  dVar4 = (this->super_Conic).p[0].z;
  dVar9 = ::sin(dVar10);
  dVar10 = (this->super_Conic).p[1].y;
  dVar5 = (this->super_Conic).p[1].z;
  dVar6 = (this->super_Conic).location.y;
  dVar7 = (this->super_Conic).location.z;
  __return_storage_ptr__->x =
       ((this->super_Conic).p[1].x * dVar9 + dVar2 * dVar8) * dVar1 + (this->super_Conic).location.x
  ;
  __return_storage_ptr__->y = (dVar10 * dVar9 + dVar3 * dVar8) * dVar1 + dVar6;
  __return_storage_ptr__->z = (dVar9 * dVar5 + dVar8 * dVar4) * dVar1 + dVar7;
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 Eval(IfcFloat u) const {
        u = -conv.angle_scale * u;
        return location + static_cast<IfcFloat>(entity.Radius)*(static_cast<IfcFloat>(std::cos(u))*p[0] +
            static_cast<IfcFloat>(std::sin(u))*p[1]);
    }